

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptSamplerType(HlslGrammar *this,TType *type)

{
  EHlslTokenClass EVar1;
  TType local_d0;
  TSampler local_34;
  TArraySizes *pTStack_30;
  TSampler sampler;
  TArraySizes *arraySizes;
  bool isShadow;
  EHlslTokenClass samplerType;
  TType *type_local;
  HlslGrammar *this_local;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  arraySizes._3_1_ = false;
  switch(EVar1) {
  case EHTokSampler:
    break;
  case EHTokSampler1d:
    break;
  case EHTokSampler2d:
    break;
  case EHTokSampler3d:
    break;
  case EHTokSamplerCube:
    break;
  case EHTokSamplerState:
    break;
  case EHTokSamplerComparisonState:
    arraySizes._3_1_ = true;
    break;
  default:
    return false;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  pTStack_30 = (TArraySizes *)0x0;
  TSampler::setPureSampler(&local_34,arraySizes._3_1_);
  TType::TType(&local_d0,&local_34,EvqUniform,pTStack_30);
  TType::shallowCopy(type,&local_d0);
  TType::~TType(&local_d0);
  return true;
}

Assistant:

bool HlslGrammar::acceptSamplerType(TType& type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    // TODO: for DX9
    // TSamplerDim dim = EsdNone;

    bool isShadow = false;

    switch (samplerType) {
    case EHTokSampler:      break;
    case EHTokSampler1d:    /*dim = Esd1D*/; break;
    case EHTokSampler2d:    /*dim = Esd2D*/; break;
    case EHTokSampler3d:    /*dim = Esd3D*/; break;
    case EHTokSamplerCube:  /*dim = EsdCube*/; break;
    case EHTokSamplerState: break;
    case EHTokSamplerComparisonState: isShadow = true; break;
    default:
        return false;  // not a sampler declaration
    }

    advanceToken();  // consume the sampler type keyword

    TArraySizes* arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.setPureSampler(isShadow);

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));

    return true;
}